

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

png_alloc_size_t png_image_size(png_structrp png_ptr)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte local_78;
  byte local_6c;
  ulong local_58;
  byte local_4c;
  byte local_40;
  uint local_34;
  png_uint_32 pw;
  int pass;
  png_alloc_size_t cb_base;
  uint pd;
  png_uint_32 w;
  png_uint_32 h;
  png_structrp png_ptr_local;
  
  uVar2 = png_ptr->height;
  if ((png_ptr->rowbytes < 0x8000) && (uVar2 < 0x8000)) {
    if (png_ptr->interlaced == '\0') {
      png_ptr_local = (png_structrp)((png_ptr->rowbytes + 1) * (ulong)uVar2);
    }
    else {
      bVar1 = png_ptr->pixel_depth;
      _pw = (png_structrp)0x0;
      for (local_34 = 0; (int)local_34 < 7; local_34 = local_34 + 1) {
        if ((int)local_34 < 2) {
          local_40 = 3;
        }
        else {
          local_40 = (byte)((int)(7 - local_34) >> 1);
        }
        if ((int)local_34 < 2) {
          local_4c = 3;
        }
        else {
          local_4c = (byte)((int)(7 - local_34) >> 1);
        }
        uVar3 = png_ptr->width +
                (((1 << (local_40 & 0x1f)) + -1) -
                ((local_34 & 1) << (3U - (char)((int)(local_34 + 1) >> 1) & 0x1f) & 7)) >>
                (local_4c & 0x1f);
        if (uVar3 != 0) {
          if (bVar1 < 8) {
            local_58 = (ulong)uVar3 * (ulong)(uint)bVar1 + 7 >> 3;
          }
          else {
            local_58 = (ulong)uVar3 * (ulong)(bVar1 >> 3);
          }
          if ((int)local_34 < 3) {
            local_6c = 3;
          }
          else {
            local_6c = (byte)((int)(8 - local_34) >> 1);
          }
          if ((int)local_34 < 3) {
            local_78 = 3;
          }
          else {
            local_78 = (byte)((int)(8 - local_34) >> 1);
          }
          _pw = (png_structrp)
                ((long)_pw->jmp_buf_local[0].__jmpbuf +
                (local_58 + 1) *
                (ulong)(uVar2 + (((1 << (local_6c & 0x1f)) + -1) -
                                (((local_34 ^ 0xffffffff) & 1) <<
                                 (3U - (char)((int)local_34 >> 1) & 0x1f) & 7)) >> (local_78 & 0x1f)
                       ));
        }
      }
      png_ptr_local = _pw;
    }
  }
  else {
    png_ptr_local = (png_structrp)0xffffffff;
  }
  return (png_alloc_size_t)png_ptr_local;
}

Assistant:

static png_alloc_size_t
png_image_size(png_structrp png_ptr)
{
   /* Only return sizes up to the maximum of a png_uint_32; do this by limiting
    * the width and height used to 15 bits.
    */
   png_uint_32 h = png_ptr->height;

   if (png_ptr->rowbytes < 32768 && h < 32768)
   {
      if (png_ptr->interlaced != 0)
      {
         /* Interlacing makes the image larger because of the replication of
          * both the filter byte and the padding to a byte boundary.
          */
         png_uint_32 w = png_ptr->width;
         unsigned int pd = png_ptr->pixel_depth;
         png_alloc_size_t cb_base;
         int pass;

         for (cb_base=0, pass=0; pass<=6; ++pass)
         {
            png_uint_32 pw = PNG_PASS_COLS(w, pass);

            if (pw > 0)
               cb_base += (PNG_ROWBYTES(pd, pw)+1) * PNG_PASS_ROWS(h, pass);
         }

         return cb_base;
      }

      else
         return (png_ptr->rowbytes+1) * h;
   }

   else
      return 0xffffffffU;
}